

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::replaceLaneI16x8
          (Literal *__return_storage_ptr__,Literal *this,Literal *other,uint8_t index)

{
  uint8_t index_local;
  Literal *other_local;
  Literal *this_local;
  
  replace<8,_&wasm::Literal::getLanesUI16x8>(__return_storage_ptr__,this,other,index);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::replaceLaneI16x8(const Literal& other, uint8_t index) const {
  return replace<8, &Literal::getLanesUI16x8>(*this, other, index);
}